

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O3

bool decendingLessThan(pair<QString,_int> *s1,pair<QString,_int> *s2)

{
  int iVar1;
  QStringView rhs;
  QStringView lhs;
  
  rhs.m_data = (s2->first).d.ptr;
  rhs.m_size = (s2->first).d.size;
  lhs.m_data = (s1->first).d.ptr;
  lhs.m_size = (s1->first).d.size;
  iVar1 = QtPrivate::compareStrings(lhs,rhs,CaseSensitive);
  return 0 < iVar1;
}

Assistant:

static bool decendingLessThan(const std::pair<QString, int> &s1, const std::pair<QString, int> &s2)
{
    return s1.first > s2.first;
}